

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O1

bool __thiscall
icu_63::double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  double_conversion *pdVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  undefined4 in_register_0000000c;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  DiyFp diy_fp;
  DiyFp input;
  int cached_decimal_exponent;
  DiyFp cached_power;
  DiyFp local_60;
  int local_4c;
  DiyFp local_48;
  DiyFp local_38;
  
  pdVar7 = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar5 = (uint)trimmed.start_;
  if (uVar5 != 0) {
    uVar3 = trimmed.length_;
    if (0x135 < (int)(uVar3 + uVar5)) {
      *pdVar7 = INFINITY;
      return true;
    }
    if (-0x144 < (int)(uVar3 + uVar5)) {
      if ((int)uVar5 < 0x10) {
        if (0xffffffe9 < uVar3) {
          if ((int)uVar5 < 1) {
            dVar14 = 0.0;
          }
          else {
            uVar8 = 1;
            uVar9 = 0;
            do {
              uVar9 = ((long)(char)this[uVar8 - 1] + uVar9 * 10) - 0x30;
              if (uVar5 <= uVar8) break;
              uVar8 = uVar8 + 1;
            } while (uVar9 < 0x1999999999999999);
            auVar15._8_4_ = (int)(uVar9 >> 0x20);
            auVar15._0_8_ = uVar9;
            auVar15._12_4_ = 0x45300000;
            dVar14 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
          }
          dVar14 = dVar14 / *(double *)(exact_powers_of_ten + (ulong)-uVar3 * 8);
LAB_0028f868:
          *pdVar7 = dVar14;
          return true;
        }
        if (uVar3 < 0x17) {
          if ((int)uVar5 < 1) {
            dVar14 = 0.0;
          }
          else {
            uVar8 = 1;
            uVar9 = 0;
            do {
              uVar9 = ((long)(char)this[uVar8 - 1] + uVar9 * 10) - 0x30;
              if (uVar5 <= uVar8) break;
              uVar8 = uVar8 + 1;
            } while (uVar9 < 0x1999999999999999);
            auVar16._8_4_ = (int)(uVar9 >> 0x20);
            auVar16._0_8_ = uVar9;
            auVar16._12_4_ = 0x45300000;
            dVar14 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
          }
          dVar14 = dVar14 * *(double *)(exact_powers_of_ten + (ulong)uVar3 * 8);
          goto LAB_0028f868;
        }
        if (-1 < (int)uVar3) {
          iVar4 = uVar3 - (0xf - uVar5);
          if (iVar4 < 0x17) {
            if ((int)uVar5 < 1) {
              dVar14 = 0.0;
            }
            else {
              uVar8 = 1;
              uVar9 = 0;
              do {
                uVar9 = ((long)(char)this[uVar8 - 1] + uVar9 * 10) - 0x30;
                if (uVar5 <= uVar8) break;
                uVar8 = uVar8 + 1;
              } while (uVar9 < 0x1999999999999999);
              auVar17._8_4_ = (int)(uVar9 >> 0x20);
              auVar17._0_8_ = uVar9;
              auVar17._12_4_ = 0x45300000;
              dVar14 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
            }
            dVar14 = dVar14 * *(double *)(exact_powers_of_ten + (long)(int)(0xf - uVar5) * 8) *
                     *(double *)(exact_powers_of_ten + (long)iVar4 * 8);
            goto LAB_0028f868;
          }
        }
      }
      if ((int)uVar5 < 1) {
        uVar8 = 0;
        local_60.f_ = 0;
      }
      else {
        uVar8 = 0;
        local_60.f_ = 0;
        do {
          pdVar1 = this + uVar8;
          uVar8 = uVar8 + 1;
          local_60.f_ = ((long)(char)*pdVar1 + local_60.f_ * 10) - 0x30;
          if (uVar5 <= uVar8) break;
        } while (local_60.f_ < 0x1999999999999999);
      }
      iVar4 = uVar5 - (int)uVar8;
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        local_60.f_ = local_60.f_ + ('4' < (char)this[(int)uVar8]);
      }
      local_60.e_ = 0;
      uVar8 = local_60.f_;
      if (local_60.f_ >> 0x36 == 0) {
        do {
          uVar8 = local_60.f_ << 10;
          local_60.e_ = local_60.e_ - 10;
          bVar13 = local_60.f_ < 0x100000000000;
          local_60.f_ = uVar8;
        } while (bVar13);
      }
      iVar12 = iVar4 + uVar3;
      for (; -1 < (long)uVar8; uVar8 = uVar8 * 2) {
        local_60.e_ = local_60.e_ - 1;
      }
      lVar10 = ((ulong)(iVar4 != 0) << 2) << (-(char)local_60.e_ & 0x3fU);
      if (-0x15d < iVar12) {
        local_48.f_ = 0;
        local_48.e_ = 0;
        local_60.f_ = uVar8;
        PowersOfTenCache::GetCachedPowerForDecimalExponent(iVar12,&local_48,&local_4c);
        iVar12 = iVar12 - local_4c;
        if (iVar12 != 0) {
          uVar3 = iVar12 - 1;
          if (6 < uVar3) {
            abort();
          }
          local_38.e_ = *(int *)(&DAT_00338cf8 + (ulong)uVar3 * 4);
          local_38.f_ = *(uint64_t *)(&DAT_00338d18 + (ulong)uVar3 * 8);
          DiyFp::Multiply(&local_60,&local_38);
          if ((int)(0x13 - uVar5) < iVar12) {
            lVar10 = lVar10 + 4;
          }
        }
        DiyFp::Multiply(&local_60,&local_48);
        uVar8 = local_60.f_;
        uVar5 = local_60.e_;
        if (local_60.f_ < 0x40000000000000) {
          do {
            uVar8 = local_60.f_ << 10;
            uVar5 = uVar5 - 10;
            bVar13 = local_60.f_ < 0x100000000000;
            local_60.f_ = uVar8;
          } while (bVar13);
        }
        for (; -1 < (long)uVar8; uVar8 = uVar8 * 2) {
          uVar5 = uVar5 - 1;
        }
        uVar9 = (9 - (ulong)(lVar10 == 0)) + lVar10 << ((char)local_60.e_ - (char)uVar5 & 0x3fU);
        iVar4 = 0;
        if (-0x472 < (int)uVar5) {
          iVar4 = uVar5 + 0x472;
        }
        iVar12 = 0x35;
        if ((int)uVar5 < -0x43d) {
          iVar12 = iVar4;
        }
        if (iVar12 < 4) {
          bVar6 = (byte)(4 - iVar12);
          local_60.f_ = uVar8 >> (bVar6 & 0x3f);
          local_60.e_ = (4 - iVar12) + uVar5;
          uVar8 = (ulong)(uint)local_60.e_;
          uVar9 = (uVar9 >> (bVar6 & 0x3f)) + 9;
          iVar12 = 0x3c;
        }
        else {
          iVar12 = 0x40 - iVar12;
          local_60.f_ = uVar8;
          local_60.e_ = uVar5;
        }
        bVar6 = (byte)iVar12;
        lVar10 = 8L << (bVar6 - 1 & 0x3f);
        uVar11 = (~(-1L << (bVar6 & 0x3f)) & local_60.f_) << 3;
        diy_fp.f_ = (ulong)(uint)(iVar12 + local_60.e_);
        uVar2 = uVar9 + lVar10;
        diy_fp._8_8_ = uVar8;
        dVar14 = (double)Double::DiyFpToUint64
                                   ((Double *)
                                    (((local_60.f_ >> (bVar6 & 0x3f)) + 1) - (ulong)(uVar11 < uVar2)
                                    ),diy_fp);
        *pdVar7 = dVar14;
        if (lVar10 - uVar9 < uVar11) {
          if (uVar11 < uVar2) {
            return INFINITY <= *pdVar7;
          }
          return true;
        }
        return true;
      }
    }
  }
  *pdVar7 = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}